

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O2

uint64_t helper_psllh_mips(uint64_t fs,uint64_t ft)

{
  long lVar1;
  uint uVar2;
  LMIValue vs;
  
  uVar2 = (uint)ft & 0x7f;
  if (0xf < uVar2) {
    return 0;
  }
  vs.d = fs;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    *(short *)((long)&vs + lVar1 * 2) = *(short *)((long)&vs + lVar1 * 2) << ((byte)uVar2 & 0x1f);
  }
  return vs.d;
}

Assistant:

uint64_t helper_psllh(uint64_t fs, uint64_t ft)
{
    LMIValue vs;
    unsigned i;

    ft &= 0x7f;
    if (ft > 15) {
        return 0;
    }
    vs.d = fs;
    for (i = 0; i < 4; ++i) {
        vs.uh[i] <<= ft;
    }
    return vs.d;
}